

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void mkstairs(level *lev,xchar x,xchar y,char up,mkroom *croom)

{
  xchar xVar1;
  xchar xVar2;
  int iVar3;
  mkroom *croom_local;
  char up_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  if (x == '\0') {
    impossible("mkstairs:  bogus stair attempt at <%d,%d>",0,(ulong)(uint)(int)y);
  }
  else {
    xVar1 = dunlev(&lev->z);
    if ((xVar1 != '\x01') || (up == '\0')) {
      xVar1 = dunlev(&lev->z);
      xVar2 = dunlevs_in_dungeon(&lev->z);
      if ((xVar1 != xVar2) || (up != '\0')) {
        if (up == '\0') {
          (lev->dnstair).sx = x;
          (lev->dnstair).sy = y;
          lev->dnstairs_room = croom;
        }
        else {
          (lev->upstair).sx = x;
          (lev->upstair).sy = y;
          lev->upstairs_room = croom;
        }
        lev->locations[x][y].typ = '\x1a';
        iVar3 = 2;
        if (up != '\0') {
          iVar3 = 1;
        }
        *(uint *)&lev->locations[x][y].field_0x6 =
             *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f | iVar3 << 4;
      }
    }
  }
  return;
}

Assistant:

void mkstairs(struct level *lev, xchar x, xchar y, char up, struct mkroom *croom)
{
	if (!x) {
	    impossible("mkstairs:  bogus stair attempt at <%d,%d>", x, y);
	    return;
	}

	/*
	 * We can't make a regular stair off an end of the dungeon.  This
	 * attempt can happen when a special level is placed at an end and
	 * has an up or down stair specified in its description file.
	 */
	if ((dunlev(&lev->z) == 1 && up) ||
			(dunlev(&lev->z) == dunlevs_in_dungeon(&lev->z) && !up))
	    return;

	if (up) {
		lev->upstair.sx = x;
		lev->upstair.sy = y;
		lev->upstairs_room = croom;
	} else {
		lev->dnstair.sx = x;
		lev->dnstair.sy = y;
		lev->dnstairs_room = croom;
	}

	lev->locations[x][y].typ = STAIRS;
	lev->locations[x][y].ladder = up ? LA_UP : LA_DOWN;
}